

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_states.cpp
# Opt level: O0

bool __thiscall FStateDefinitions::SetStop(FStateDefinitions *this)

{
  FStateDefinitions *this_local;
  
  if (this->laststate == (FState *)0x0) {
    if (this->lastlabel < 0) {
      this_local._7_1_ = false;
    }
    else {
      RetargetStates(this,this->lastlabel + 1,(char *)0x0);
      if (this->laststatebeforelabel != (FState *)0x0) {
        this->laststatebeforelabel->DefineFlags = '\x02';
        this->laststatebeforelabel = (FState *)0x0;
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this->laststate->DefineFlags = '\x02';
    this->laststatebeforelabel = (FState *)0x0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool FStateDefinitions::SetStop()
{
	if (laststate != NULL)
	{
		laststate->DefineFlags = SDF_STOP;
		laststatebeforelabel = NULL;
		return true;
	}
	else if (lastlabel >=0)
	{
		RetargetStates (lastlabel+1, NULL);
		if (laststatebeforelabel != NULL)
		{
			laststatebeforelabel->DefineFlags = SDF_STOP;
			laststatebeforelabel = NULL;
		}
		return true;
	}
	return false;
}